

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ParseCommonOptions_abi_cxx11_(OptionMap *options,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  int in_EDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string argstr;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  mapped_type *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  value_type *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char **in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  key_type *in_stack_ffffffffffffff78;
  key_type in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffb0;
  string local_48 [32];
  int local_28;
  undefined1 local_21;
  int local_14;
  
  local_21 = 0;
  local_14 = in_EDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x111a50);
  local_28 = 1;
  while (local_28 < local_14) {
    GetNextArg_abi_cxx11_
              ((int *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68)
    ;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff84 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
    if (bVar1) {
      in_stack_ffffffffffffff80 =
           GetIArg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                   (char **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      in_stack_ffffffffffffff78 =
           (key_type *)
           std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
           ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
      *in_stack_ffffffffffffff78 = in_stack_ffffffffffffff80;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                              (char *)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff74 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff74);
      if (bVar1) {
        iVar2 = GetIArg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                        (char **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        in_stack_ffffffffffffffa4 = 1;
        in_stack_ffffffffffffff68 =
             (char **)std::
                      map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                      ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff78);
        *(int *)in_stack_ffffffffffffff68 = iVar2;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                (char *)in_stack_ffffffffffffff38);
        if (bVar1) {
          iVar2 = GetIArg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          (char **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          in_stack_ffffffffffffffa0 = 2;
          pmVar3 = std::
                   map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                   ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78);
          *pmVar3 = iVar2;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                  (char *)in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff54 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
          if (bVar1) {
            in_stack_ffffffffffffff50 =
                 GetIArg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                         (char **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
            in_stack_ffffffffffffff48 =
                 (value_type *)
                 std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff78);
            *(int *)in_stack_ffffffffffffff48 = in_stack_ffffffffffffff50;
          }
          else {
            in_stack_ffffffffffffff47 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                 (char *)in_stack_ffffffffffffff38);
            if ((bool)in_stack_ffffffffffffff47) {
              in_stack_ffffffffffffff38 =
                   std::
                   map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                   ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78);
              *in_stack_ffffffffffffff38 = 1;
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_48);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> ParseCommonOptions(OptionMap & options, int argc, char ** argv)
{
    std::vector<std::string> ret;

    int i = 1;
    while(i < argc)
    {
        std::string argstr(GetNextArg(i, argc, argv));
        if(argstr == "-ve")
            options[Option::ExternalVRR] = GetIArg(i, argc, argv);
        else if(argstr == "-vg")
            options[Option::GeneralVRR] = GetIArg(i, argc, argv);
        else if(argstr == "-he")
            options[Option::ExternalHRR] = GetIArg(i, argc, argv);
        else if(argstr == "-hg")
            options[Option::GeneralHRR] = GetIArg(i, argc, argv);
        else if(argstr == "-p")
            options[Option::FinalPermute] = 1;
        else
            ret.push_back(argstr);
    }

    return ret;
}